

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
::merge(btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
        *this,btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
              *src,allocator_type *alloc)

{
  allocator_type *paVar1;
  byte bVar2;
  byte bVar3;
  field_type fVar4;
  byte bVar5;
  bool bVar6;
  field_type fVar7;
  field_type fVar8;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *pbVar9;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *pbVar10;
  field_type local_2a;
  byte local_29;
  field_type j;
  slot_type *psStack_28;
  field_type i;
  allocator_type *local_20;
  allocator_type *alloc_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *src_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
  *this_local;
  
  local_20 = alloc;
  alloc_local = (allocator_type *)src;
  src_local = this;
  pbVar9 = parent(this);
  pbVar10 = parent((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                    *)alloc_local);
  if (pbVar9 != pbVar10) {
    __assert_fail("parent() == src->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x7b6,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>]"
                 );
  }
  bVar2 = position(this);
  bVar3 = position((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                    *)alloc_local);
  if (bVar2 + 1 != (uint)bVar3) {
    __assert_fail("position() + 1 == src->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x7b7,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::map_params<std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::util::(anonymous namespace)::FieldMaskTree::Node>>>, 256, false>]"
                 );
  }
  fVar4 = finish(this);
  paVar1 = local_20;
  pbVar9 = parent(this);
  bVar2 = position(this);
  psStack_28 = slot(pbVar9,(ulong)bVar2);
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>
  ::
  value_init<absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>*>
            ((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>,256,false>>
              *)this,fVar4,paVar1,&stack0xffffffffffffffd8);
  bVar2 = count((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                 *)alloc_local);
  bVar3 = finish(this);
  bVar5 = start((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                 *)alloc_local);
  transfer_n(this,(ulong)bVar2,(long)(int)(bVar3 + 1),(ulong)bVar5,
             (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
              *)alloc_local,local_20);
  bVar6 = is_internal(this);
  if (bVar6) {
    local_29 = start((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                      *)alloc_local);
    local_2a = finish(this);
    while( true ) {
      local_2a = local_2a + '\x01';
      bVar2 = finish((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                      *)alloc_local);
      if (bVar2 < local_29) break;
      pbVar9 = child((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                      *)alloc_local,local_29);
      init_child(this,local_2a,pbVar9);
      clear_child((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                   *)alloc_local,local_29);
      local_29 = local_29 + 1;
    }
  }
  fVar4 = start(this);
  fVar7 = count(this);
  fVar8 = count((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                 *)alloc_local);
  set_finish(this,fVar4 + '\x01' + fVar7 + fVar8);
  paVar1 = alloc_local;
  fVar4 = start((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
                 *)alloc_local);
  set_finish((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>,_256,_false>_>
              *)paVar1,fVar4);
  pbVar9 = parent(this);
  fVar4 = position(this);
  remove_values(pbVar9,fVar4,'\x01',local_20);
  return;
}

Assistant:

void btree_node<P>::merge(btree_node *src, allocator_type *alloc) {
  assert(parent() == src->parent());
  assert(position() + 1 == src->position());

  // Move the delimiting value to the left node.
  value_init(finish(), alloc, parent()->slot(position()));

  // Move the values from the right to the left node.
  transfer_n(src->count(), finish() + 1, src->start(), src, alloc);

  if (is_internal()) {
    // Move the child pointers from the right to the left node.
    for (field_type i = src->start(), j = finish() + 1; i <= src->finish();
         ++i, ++j) {
      init_child(j, src->child(i));
      src->clear_child(i);
    }
  }

  // Fixup `finish` on the src and dest nodes.
  set_finish(start() + 1 + count() + src->count());
  src->set_finish(src->start());

  // Remove the value on the parent node and delete the src node.
  parent()->remove_values(position(), /*to_erase=*/1, alloc);
}